

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

int ecx_waitinframe_red(ecx_portt *port,int idx,osal_timert *timer)

{
  boolean bVar1;
  uint uVar2;
  bool bVar3;
  int local_38;
  int local_34;
  int secrx;
  int primrx;
  int wkc2;
  int wkc;
  osal_timert timer2;
  osal_timert *timer_local;
  int idx_local;
  ecx_portt *port_local;
  
  primrx = -1;
  secrx = -1;
  timer2.stop_time = (ec_timet)timer;
  if (port->redstate == 0) {
    secrx = 0;
  }
  do {
    if (0x7fffffff < (uint)primrx) {
      primrx = ecx_inframe(port,idx,0);
    }
    if ((port->redstate != 0) && (0x7fffffff < (uint)secrx)) {
      secrx = ecx_inframe(port,idx,1);
    }
    if ((primrx < 0) || (bVar3 = false, 0x7fffffff < (uint)secrx)) {
      bVar1 = osal_timer_is_expired((osal_timert *)timer2.stop_time);
      bVar3 = bVar1 == '\0';
    }
  } while (bVar3);
  if (port->redstate != 0) {
    local_34 = 0;
    if (-1 < primrx) {
      local_34 = port->rxsa[idx];
    }
    local_38 = 0;
    if (-1 < secrx) {
      local_38 = port->redport->rxsa[idx];
    }
    if ((local_34 == 0x404) && (local_38 == 0x101)) {
      memcpy(port->rxbuf + idx,port->redport->rxbuf + idx,(long)port->txbuflength[idx] - 0xe);
      primrx = secrx;
    }
    if (((local_34 == 0) && (local_38 == 0x404)) || ((local_34 == 0x101 && (local_38 == 0x404)))) {
      if ((local_34 == 0x101) && (local_38 == 0x404)) {
        memcpy(port->txbuf[idx] + 0xe,port->rxbuf + idx,(long)port->txbuflength[idx] - 0xe);
      }
      osal_timer_start((osal_timert *)&wkc2,2000);
      ecx_outframe(port,idx,1);
      do {
        uVar2 = ecx_inframe(port,idx,1);
        bVar3 = false;
        if (0x7fffffff < uVar2) {
          bVar1 = osal_timer_is_expired((osal_timert *)&wkc2);
          bVar3 = bVar1 == '\0';
        }
      } while (bVar3);
      if (-1 < (int)uVar2) {
        memcpy(port->rxbuf + idx,port->redport->rxbuf + idx,(long)port->txbuflength[idx] - 0xe);
        primrx = uVar2;
      }
    }
  }
  return primrx;
}

Assistant:

static int ecx_waitinframe_red(ecx_portt *port, int idx, osal_timert *timer)
{
   osal_timert timer2;
   int wkc  = EC_NOFRAME;
   int wkc2 = EC_NOFRAME;
   int primrx, secrx;
   
   /* if not in redundant mode then always assume secondary is OK */
   if (port->redstate == ECT_RED_NONE)
      wkc2 = 0;
   do 
   {
      /* only read frame if not already in */
      if (wkc <= EC_NOFRAME)
         wkc  = ecx_inframe(port, idx, 0);
      /* only try secondary if in redundant mode */
      if (port->redstate != ECT_RED_NONE)
      {   
         /* only read frame if not already in */
         if (wkc2 <= EC_NOFRAME)
            wkc2 = ecx_inframe(port, idx, 1);
      }   
   /* wait for both frames to arrive or timeout */   
   } while (((wkc <= EC_NOFRAME) || (wkc2 <= EC_NOFRAME)) && !osal_timer_is_expired(timer));
   /* only do redundant functions when in redundant mode */
   if (port->redstate != ECT_RED_NONE)
   {
      /* primrx if the reveived MAC source on primary socket */
      primrx = 0;
      if (wkc > EC_NOFRAME) primrx = port->rxsa[idx];
      /* secrx if the reveived MAC source on psecondary socket */
      secrx = 0;
      if (wkc2 > EC_NOFRAME) secrx = port->redport->rxsa[idx];
      
      /* primary socket got secondary frame and secondary socket got primary frame */
      /* normal situation in redundant mode */
      if ( ((primrx == RX_SEC) && (secrx == RX_PRIM)) )
      {
         /* copy secondary buffer to primary */
         memcpy(&(port->rxbuf[idx]), &(port->redport->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
         wkc = wkc2;
      }   
      /* primary socket got nothing or primary frame, and secondary socket got secondary frame */
      /* we need to resend TX packet */ 
      if ( ((primrx == 0) && (secrx == RX_SEC)) ||
           ((primrx == RX_PRIM) && (secrx == RX_SEC)) )
      {
         /* If both primary and secondary have partial connection retransmit the primary received
          * frame over the secondary socket. The result from the secondary received frame is a combined
          * frame that traversed all slaves in standard order. */
         if ( (primrx == RX_PRIM) && (secrx == RX_SEC) )
         {   
            /* copy primary rx to tx buffer */
            memcpy(&(port->txbuf[idx][ETH_HEADERSIZE]), &(port->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
         }
         osal_timer_start (&timer2, EC_TIMEOUTRET);
         /* resend secondary tx */
         ecx_outframe(port, idx, 1);
         do 
         {
            /* retrieve frame */
            wkc2 = ecx_inframe(port, idx, 1);
         } while ((wkc2 <= EC_NOFRAME) && !osal_timer_is_expired(&timer2));
         if (wkc2 > EC_NOFRAME)
         {   
            /* copy secondary result to primary rx buffer */
            memcpy(&(port->rxbuf[idx]), &(port->redport->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
            wkc = wkc2;
         }   
      }      
   }
   
   /* return WKC or EC_NOFRAME */
   return wkc;
}